

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_quick_sort_recursive(int64_t *dst,size_t original_left,size_t original_right)

{
  long *plVar1;
  size_t original_right_00;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t _sort_swap_temp;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  lVar5 = 0x3f;
  if (original_right - original_left != 0) {
    for (; original_right - original_left >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar10 = 0;
  while( true ) {
    uVar7 = original_right - original_left;
    if (original_right < original_left || uVar7 == 0) {
      return;
    }
    uVar8 = uVar7 + 1;
    if (uVar8 < 0x11) {
      sorter_bitonic_sort(dst + original_left,uVar8);
      return;
    }
    if ((uVar10 ^ (uint)lVar5 ^ 0x3f) == 0x3f) {
      sorter_heap_sort(dst + original_left,uVar8);
      return;
    }
    uVar10 = uVar10 + 1;
    uVar9 = (uVar7 >> 1) + original_left;
    lVar2 = dst[original_right];
    uVar8 = original_left;
    if (dst[original_left] < lVar2) {
      uVar8 = original_right;
    }
    uVar12 = uVar9;
    if (dst[uVar9] < lVar2) {
      uVar12 = original_right;
      uVar8 = uVar9;
    }
    if (dst[original_left] < dst[uVar9]) {
      uVar12 = uVar8;
    }
    uVar8 = (uVar7 >> 2) + original_left;
    uVar9 = (original_right - uVar9 >> 1) + uVar9;
    uVar7 = uVar8;
    if (dst[uVar8] < dst[uVar9]) {
      uVar7 = uVar9;
    }
    plVar1 = dst + uVar12;
    if (dst[uVar9] <= *plVar1) {
      uVar9 = uVar12;
      uVar12 = uVar7;
    }
    if (dst[uVar8] < *plVar1) {
      uVar9 = uVar12;
    }
    iVar3 = dst[uVar9];
    dst[uVar9] = lVar2;
    dst[original_right] = iVar3;
    uVar6 = 0;
    uVar8 = original_left;
    for (uVar7 = original_left; uVar7 < original_right; uVar7 = uVar7 + 1) {
      iVar4 = dst[uVar7];
      uVar11 = (int)iVar4 - (int)iVar3;
      if ((int)uVar11 < 0) {
        dst[uVar7] = dst[uVar8];
        dst[uVar8] = iVar4;
        uVar8 = uVar8 + 1;
      }
      uVar6 = uVar6 | uVar11;
    }
    iVar3 = dst[original_right];
    dst[original_right] = dst[uVar8];
    dst[uVar8] = iVar3;
    if (uVar6 == 0) break;
    if (uVar8 == 0xffffffffffffffff) {
      return;
    }
    original_right_00 = uVar8 - 1;
    if (~uVar8 + original_right < original_right_00 - original_left) {
      sorter_quick_sort_recursive(dst,uVar8 + 1,original_right);
      original_right = original_right_00;
    }
    else {
      sorter_quick_sort_recursive(dst,original_left,original_right_00);
      original_left = uVar8 + 1;
    }
  }
  return;
}

Assistant:

static void QUICK_SORT_RECURSIVE(SORT_TYPE *dst, const size_t original_left,
                                 const size_t original_right) {
  size_t left;
  size_t right;
  size_t pivot;
  size_t new_pivot;
  size_t middle;
  int loop_count = 0;
  const int max_loops = 64 - CLZ(original_right - original_left); /* ~lg N */
  left = original_left;
  right = original_right;

  while (1) {
    if (right <= left) {
      return;
    }

    if ((right - left + 1U) <= SMALL_SORT_BND) {
      SMALL_SORT(&dst[left], right - left + 1U);
      return;
    }

    if (++loop_count >= max_loops) {
      /* we have recursed / looped too many times; switch to heap sort */
      HEAP_SORT(&dst[left], right - left + 1U);
      return;
    }

    /* median of 5 */
    middle = left + ((right - left) >> 1);
    pivot = MEDIAN((const SORT_TYPE *)dst, left, middle, right);
    pivot = MEDIAN((const SORT_TYPE *)dst, left + ((middle - left) >> 1), pivot,
                   middle + ((right - middle) >> 1));
    new_pivot = QUICK_SORT_PARTITION(dst, left, right, pivot);

    /* check for partition all equal */
    if (new_pivot == SIZE_MAX) {
      return;
    }

    /* recurse only on the small part to avoid degenerate stack sizes */
    /* and manually do tail call on the large part */
    if (new_pivot - 1U - left > right - new_pivot - 1U) {
      /* left is bigger than right */
      QUICK_SORT_RECURSIVE(dst, new_pivot + 1U, right);
      /* tail call for left */
      right = new_pivot - 1U;
    } else {
      /* right is bigger than left */
      QUICK_SORT_RECURSIVE(dst, left, new_pivot - 1U);
      /* tail call for right */
      left = new_pivot + 1U;
    }
  }
}